

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer_impl.cpp
# Opt level: O3

tuple<bool,_float>
intersect_triangle(vector<float,_std::allocator<float>_> *origin,Vector3f *ray,Vector3f *e1,
                  Vector3f *e2,Vector3f *v0)

{
  undefined8 *puVar1;
  uint uVar2;
  undefined1 uVar3;
  ulong uVar4;
  SrcEvaluatorType *in_R9;
  long lVar5;
  long lVar6;
  Index IVar7;
  SrcEvaluatorType srcEvaluator_1;
  bool bVar8;
  SrcEvaluatorType srcEvaluator;
  MatrixXf A;
  Vector3f x;
  assign_op<float,_float> local_d9;
  undefined1 local_d8 [16];
  DenseStorage<float,__1,__1,__1,_0> local_c8;
  SrcEvaluatorType *local_b0;
  undefined1 local_a8 [8];
  float local_a0;
  long local_98;
  DstXprType local_90;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>,_Eigen::internal::assign_op<float,_float>,_0>
  local_50;
  
  local_c8.m_data = (PointerType)0x0;
  local_c8.m_rows = 0;
  local_c8.m_cols = 0;
  local_b0 = in_R9;
  Eigen::DenseStorage<float,_-1,_-1,_-1,_0>::resize
            ((DenseStorage<float,__1,__1,__1,_0> *)(local_d8 + 0x10),9,3,3);
  local_50.m_dstExpr = &local_90;
  local_90.super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_data =
       local_c8.m_data;
  local_90.super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_rows.
  m_value = 3;
  local_90.super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_cols.
  m_value = 1;
  local_90.super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.m_startRow.
  m_value = 0;
  local_90.super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.m_startCol.
  m_value = 0;
  local_90.super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.m_outerStride
       = local_c8.m_rows;
  local_50.m_dst = (DstEvaluatorType *)local_a8;
  local_a8 = (undefined1  [8])local_c8.m_data;
  local_98 = local_c8.m_rows;
  local_50.m_functor = &local_d9;
  local_d8._0_8_ = e2;
  local_90.super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.m_xpr =
       (XprTypeNested)(local_d8 + 0x10);
  local_50.m_src = (SrcEvaluatorType *)local_d8;
  Eigen::internal::
  dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>,_Eigen::internal::assign_op<float,_float>,_0>,_4,_0>
  ::run(&local_50);
  lVar6 = 0;
  bVar8 = local_c8.m_cols == 1;
  uVar2 = (uint)bVar8 * 3;
  IVar7 = local_c8.m_rows;
  if (bVar8) {
    IVar7 = lVar6;
  }
  local_c8.m_data[(ulong)uVar2 + IVar7] =
       (v0->super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[0];
  local_c8.m_data[(ulong)uVar2 + IVar7 + 1] =
       (v0->super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[1];
  local_c8.m_data[(ulong)uVar2 + IVar7 + 2] =
       (v0->super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[2];
  lVar5 = 2 - (ulong)bVar8;
  uVar4 = (ulong)bVar8 * 3 + 3;
  if (lVar5 != local_c8.m_cols) {
    uVar4 = (ulong)uVar2;
    lVar6 = lVar5;
  }
  lVar6 = lVar6 * local_c8.m_rows;
  local_c8.m_data[uVar4 + lVar6] =
       -(e1->super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[0];
  local_c8.m_data[uVar4 + lVar6 + 1] =
       -(e1->super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[1];
  local_c8.m_data[uVar4 + lVar6 + 2] =
       -(e1->super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[2];
  Eigen::HouseholderQR<Eigen::Matrix<float,-1,-1,0,-1,-1>>::
  HouseholderQR<Eigen::Matrix<float,_1,_1,0,_1,_1>>
            ((HouseholderQR<Eigen::Matrix<float,_1,_1,0,_1,_1>> *)&local_90,
             (EigenBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)(local_d8 + 0x10));
  puVar1 = *(undefined8 **)
            (ray->super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>).m_storage.m_data.
            array;
  local_d8._0_8_ = *puVar1;
  local_d8._8_4_ = *(undefined4 *)(puVar1 + 1);
  local_50.m_src = local_b0;
  local_50.m_dst = (DstEvaluatorType *)local_d8;
  Eigen::HouseholderQR<Eigen::Matrix<float,-1,-1,0,-1,-1>>::
  _solve_impl<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,float>,Eigen::Matrix<float,3,1,0,3,1>const,Eigen::Matrix<float,3,1,0,3,1>const>,Eigen::Matrix<float,3,1,0,3,1>>
            ((HouseholderQR<Eigen::Matrix<float,_1,_1,0,_1,_1>> *)&local_90,
             (CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>
              *)&local_50,(Matrix<float,_3,_1,_0,_3,_1> *)local_a8);
  free((void *)local_90.
               super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
               .super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
               m_startCol.m_value);
  free(local_90.
       super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.m_xpr);
  free(local_90.
       super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
       super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_data
      );
  if (((((float)local_a8._0_4_ < 0.0) || ((float)local_a8._4_4_ < 0.0)) ||
      (1.0 < (float)local_a8._0_4_ + (float)local_a8._4_4_)) || (uVar3 = 1, local_a0 <= 0.0)) {
    uVar3 = 0;
    local_a0 = 0.0;
  }
  *(float *)&(origin->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start = local_a0;
  *(undefined1 *)
   ((long)&(origin->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_start + 4) = uVar3;
  free(local_c8.m_data);
  return (tuple<bool,_float>)(_Tuple_impl<0UL,_bool,_float>)origin;
}

Assistant:

std::tuple<bool, float> intersect_triangle(
		std::vector<float> const& origin,
		Eigen::Vector3f const& ray,
		Eigen::Vector3f const& e1,
		Eigen::Vector3f const& e2,
		Eigen::Vector3f const& v0) {
	using namespace Eigen;
	auto A = MatrixXf(3, 3);
	A << e1, e2, -ray;
	auto x = static_cast<Vector3f>(A.householderQr().solve(Vector3f(origin.data())-v0));
	if(0 <= x[0] && 0 <= x[1] && x[0]+x[1] <= 1.0 && 0 < x[2]) {
		return std::make_tuple(true, x[2]);
	}
	return std::make_tuple(false, 0.0);
}